

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5CloseMethod(sqlite3_vtab_cursor *pCursor)

{
  long lVar1;
  long *in_RDI;
  Fts5Cursor *unaff_retaddr;
  Fts5Cursor **pp;
  Fts5Cursor *pCsr;
  Fts5FullTable *pTab;
  long *local_20;
  
  if (in_RDI != (long *)0x0) {
    lVar1 = *in_RDI;
    fts5FreeCursorComponents(unaff_retaddr);
    for (local_20 = (long *)(*(long *)(lVar1 + 0x30) + 0x58); (long *)*local_20 != in_RDI;
        local_20 = (long *)(*local_20 + 8)) {
    }
    *local_20 = in_RDI[1];
    sqlite3_free((void *)0x26338a);
  }
  return 0;
}

Assistant:

static int fts5CloseMethod(sqlite3_vtab_cursor *pCursor){
  if( pCursor ){
    Fts5FullTable *pTab = (Fts5FullTable*)(pCursor->pVtab);
    Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
    Fts5Cursor **pp;

    fts5FreeCursorComponents(pCsr);
    /* Remove the cursor from the Fts5Global.pCsr list */
    for(pp=&pTab->pGlobal->pCsr; (*pp)!=pCsr; pp=&(*pp)->pNext);
    *pp = pCsr->pNext;

    sqlite3_free(pCsr);
  }
  return SQLITE_OK;
}